

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O2

void o3dgc::SphereToCube<long>(long x,long y,long z,long *a,long *b,char *index)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = -x;
  uVar4 = x;
  if (x < 1) {
    uVar4 = uVar3;
  }
  uVar5 = -y;
  uVar2 = y;
  if (y < 1) {
    uVar2 = uVar5;
  }
  uVar1 = -z;
  uVar6 = z;
  if (z < 1) {
    uVar6 = uVar1;
  }
  if (uVar6 < uVar2 || uVar6 < uVar4) {
    if (uVar2 < uVar6 || uVar2 < uVar4) {
      if (uVar4 < uVar6 || uVar4 < uVar2) {
        return;
      }
      if (x < 0) {
        *index = '\x05';
        *a = -y;
        uVar5 = uVar1;
      }
      else {
        *index = '\x04';
        *a = y;
        uVar5 = z;
      }
    }
    else if (y < 0) {
      *index = '\x03';
      *a = uVar1;
      uVar5 = uVar3;
    }
    else {
      *index = '\x02';
      *a = z;
      uVar5 = x;
    }
  }
  else if (z < 0) {
    *index = '\x01';
    *a = uVar3;
  }
  else {
    *index = '\0';
    *a = x;
    uVar5 = y;
  }
  *b = uVar5;
  return;
}

Assistant:

inline const T absolute(const T& a)
    {
        return (a < (T)(0)) ? -a : a;
    }